

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

int __thiscall bdQuery::nextQuery(bdQuery *this,bdId *id,bdNodeId *targetNodeId)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  size_type sVar5;
  pointer ppVar6;
  _Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_> local_98;
  _Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_> local_90;
  _Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_> local_88;
  long local_80;
  time_t age;
  undefined8 local_6d;
  bdNodeId midRndId;
  bool queryPeer;
  int local_44;
  iterator iStack_40;
  int i;
  iterator it;
  bool notFinished;
  time_t now;
  bdNodeId *targetNodeId_local;
  bdId *id_local;
  bdQuery *this_local;
  
  if ((this->mState == 2) || ((this->mQueryFlags & 2) != 0)) {
    tVar4 = time((time_t *)0x0);
    if (((long)this->mQueryIdlePeerRetryPeriod < (tVar4 - this->mQueryTS) / 2) &&
       (this->mQueryIdlePeerRetryPeriod = (int32_t)((tVar4 - this->mQueryTS) / 2),
       0x4b0 < this->mQueryIdlePeerRetryPeriod)) {
      this->mQueryIdlePeerRetryPeriod = 0x4b0;
    }
    it._M_node._7_1_ = 0;
    std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::_Rb_tree_iterator
              (&stack0xffffffffffffffc0);
    local_44 = 0;
    iStack_40 = std::
                multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                ::begin(&this->mClosest);
    while( true ) {
      register0x00000000 =
           std::
           multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
           ::end(&this->mClosest);
      bVar1 = std::operator!=(&stack0xffffffffffffffc0,(_Self *)(midRndId.data + 0xd));
      if (!bVar1) break;
      midRndId.data[0xc] = '\0';
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->
                         (&stack0xffffffffffffffc0);
      if ((ppVar6->second).mLastSendTime == 0) {
        midRndId.data[0xc] = '\x01';
      }
      if ((((midRndId.data[0xc] & 1) == 0) && ((this->mQueryFlags & 2) != 0)) &&
         (ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->
                             (&stack0xffffffffffffffc0),
         (long)this->mQueryIdlePeerRetryPeriod < tVar4 - (ppVar6->second).mLastSendTime)) {
        midRndId.data[0xc] = '\x01';
      }
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->
                         (&stack0xffffffffffffffc0);
      if ((((ppVar6->second).mLastRecvTime == 0) ||
          (ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->
                              (&stack0xffffffffffffffc0),
          tVar4 - (ppVar6->second).mLastRecvTime < 10)) &&
         (uVar2 = (*this->mFns->_vptr_bdDhtFunctions[2])(), local_44 < (int)(uVar2 & 0xffff))) {
        it._M_node._7_1_ = 1;
      }
      if ((midRndId.data[0xc] & 1) != 0) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->
                           (&stack0xffffffffffffffc0);
        memcpy(id,&ppVar6->second,0x24);
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->
                           (&stack0xffffffffffffffc0);
        (ppVar6->second).mLastSendTime = tVar4;
        if ((this->mQueryFlags & 1) == 0) {
          *(undefined8 *)targetNodeId->data = *(undefined8 *)(this->mId).data;
          *(undefined8 *)(targetNodeId->data + 8) = *(undefined8 *)((this->mId).data + 8);
          *(undefined4 *)(targetNodeId->data + 0x10) = *(undefined4 *)((this->mId).data + 0x10);
        }
        else {
          (*this->mFns->_vptr_bdDhtFunctions[9])(this->mFns,this,&id->id,&local_6d);
          *(undefined8 *)targetNodeId->data = local_6d;
          *(undefined8 *)(targetNodeId->data + 8) = midRndId.data._0_8_;
          *(undefined4 *)(targetNodeId->data + 0x10) = midRndId.data._8_4_;
        }
        return 1;
      }
      age = (time_t)std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator++
                              (&stack0xffffffffffffffc0,0);
      local_44 = local_44 + 1;
    }
    local_80 = tVar4 - this->mQueryTS;
    if (9 < local_80) {
      if (local_80 < 0x12d) {
        sVar5 = std::
                multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                ::size(&this->mClosest);
        iVar3 = (*this->mFns->_vptr_bdDhtFunctions[2])();
        if ((sVar5 < (ushort)iVar3) || ((it._M_node._7_1_ & 1) != 0)) {
          return 0;
        }
      }
      if (this->mState == 2) {
        this->mSearchTime = (int)tVar4 - (int)this->mQueryTS;
      }
      removeOldPotentialPeers(this);
      sVar5 = std::
              multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
              ::size(&this->mClosest);
      if (sVar5 == 0) {
        this->mState = 3;
      }
      else {
        local_88._M_node =
             (_Base_ptr)
             std::
             multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
             ::begin(&this->mClosest);
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_88);
        iVar3 = ::operator==(&(ppVar6->second).mPeerId.id,&this->mId);
        bVar1 = false;
        if (iVar3 != 0) {
          local_90._M_node =
               (_Base_ptr)
               std::
               multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               ::begin(&this->mClosest);
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_90)
          ;
          bVar1 = (ppVar6->second).mLastRecvTime != 0;
        }
        if (bVar1) {
          this->mState = 6;
        }
        else {
          local_98._M_node =
               (_Base_ptr)
               std::
               multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               ::begin(&this->mPotentialPeers);
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_98)
          ;
          iVar3 = ::operator==(&(ppVar6->second).mPeerId.id,&this->mId);
          if (iVar3 == 0) {
            this->mState = 4;
          }
          else {
            this->mState = 5;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int bdQuery::nextQuery(bdId &id, bdNodeId &targetNodeId) {
	if ((mState != BITDHT_QUERY_QUERYING) && !(mQueryFlags & BITDHT_QFLAGS_DO_IDLE)) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "NextQuery() Query is done\n");
#endif
		return 0;
	}

	/* search through through list, find closest not queried */
	time_t now = time(NULL);

	/* update IdlePeerRetry */
	if ((now - mQueryTS) / 2 > mQueryIdlePeerRetryPeriod) {
		mQueryIdlePeerRetryPeriod = (now-mQueryTS) / 2;
		if (mQueryIdlePeerRetryPeriod > MAX_QUERY_IDLE_PERIOD) {
			mQueryIdlePeerRetryPeriod = MAX_QUERY_IDLE_PERIOD;
		}
	}

	bool notFinished = false;
	std::multimap<bdMetric, bdPeer>::iterator it;
	int i = 0;
	for (it = mClosest.begin(); it != mClosest.end(); it++, i++) {
		bool queryPeer = false;

		/* if never queried */
		if (it->second.mLastSendTime == 0) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Found non-sent peer. queryPeer = true : ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			queryPeer = true;
		}

		/* re-request every so often */
		if ((!queryPeer) && (mQueryFlags & BITDHT_QFLAGS_DO_IDLE) && 
			(now - it->second.mLastSendTime > mQueryIdlePeerRetryPeriod)) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Found out-of-date. queryPeer = true : ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			queryPeer = true;
		}
		
		/* expecting every peer to be up-to-date is too hard...
		 * enough just to have received lists from each 
		 * - replacement policy will still work.
		 *
		 * Need to wait at least EXPECTED_REPLY, to make sure their answers are pinged
		 */	

		if (((it->second.mLastRecvTime == 0) || (now - it->second.mLastRecvTime < EXPECTED_REPLY)) && 
				(i < mFns->bdNumQueryNodes())) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Never Received @Idx(%d) notFinished = true: ", i);
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			notFinished = true;
		}

		if (queryPeer) {
			id = it->second.mPeerId;
			it->second.mLastSendTime = now;

			if (mQueryFlags & BITDHT_QFLAGS_DISGUISE) {
				/* calc Id mid point between Target and Peer */
				bdNodeId midRndId;
				mFns->bdRandomMidId(&mId, &(id.id), &midRndId);

				targetNodeId = midRndId;
			} else
				targetNodeId = mId;

#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Querying Peer: ");
			mFns->bdPrintId(std::cerr, &id);
			std::cerr << std::endl;
#endif
			return 1;
		}
	}

	/* allow query to run for a minimal amount of time
	 * This is important as startup - when we might not have any peers.	
	 * Probably should be handled elsewhere.
	 */
	time_t age = now - mQueryTS;

	if (age < BITDHT_MIN_QUERY_AGE) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() under Min Time: Query not finished / No Query\n");
#endif
		return 0;
	}

	if (age > BITDHT_MAX_QUERY_AGE) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() over Max Time: Query force to Finish\n");
#endif
		/* fall through and stop */
	} else if ((mClosest.size() < mFns->bdNumQueryNodes()) || (notFinished)) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() notFinished | !size(): Query not finished / No Query\n");
#endif
		/* not full yet... */
		return 0;
	}

#ifdef DEBUG_QUERY 
	fprintf(stderr, "NextQuery() Finished\n");
#endif

	/* if we get here - query finished */
	if (mState == BITDHT_QUERY_QUERYING) {
		/* store query time */
		mSearchTime = now - mQueryTS;
	}

	/* cleanup PotentialPeers before doing the final State */;
	removeOldPotentialPeers();
	/* check if we found the node */
	if (mClosest.size() > 0) {
		if (((mClosest.begin()->second).mPeerId.id == mId) && 
			((mClosest.begin()->second).mLastRecvTime != 0))
			mState = BITDHT_QUERY_SUCCESS;
		else if ((mPotentialPeers.begin()->second).mPeerId.id == mId)
			mState = BITDHT_QUERY_PEER_UNREACHABLE;
		else
			mState = BITDHT_QUERY_FOUND_CLOSEST;
	} else
		mState = BITDHT_QUERY_FAILURE;
	return 0;
}